

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxOut.cpp
# Opt level: O2

void __thiscall
OpenMD::FluxOut::FluxOut(FluxOut *this,SimInfo *info,string *filename,string *sele1,int axis)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele1);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer = (_func_int **)&PTR__FluxOut_00221a50;
  (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->axis_ = axis;
  getPrefix(&local_60,filename);
  std::operator+(&local_40,&local_60,".fluxOut");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

FluxOut::FluxOut(SimInfo* info, const std::string& filename,
		   const std::string& sele1, int axis) :
    SequentialAnalyzer(info, filename, sele1, sele1), axis_(axis) {
    setOutputName(getPrefix(filename) + ".fluxOut");
  }